

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

bool el::base::utils::File::pathExists(char *path,bool considerFile)

{
  int iVar1;
  stat st;
  stat local_90;
  
  if (path != (char *)0x0) {
    iVar1 = stat(path,&local_90);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

static inline bool pathExists(const char* path, bool considerFile = false) {
        if (path == nullptr) {
            return false;
        }
#if ELPP_OS_UNIX
        ELPP_UNUSED(considerFile);
        struct stat st;
        return (stat(path, &st) == 0);
#elif ELPP_OS_WINDOWS
        DWORD fileType = GetFileAttributesA(path);
        if (fileType == INVALID_FILE_ATTRIBUTES) {
            return false;
        }
        return considerFile ? true : ((fileType & FILE_ATTRIBUTE_DIRECTORY) == 0 ? false : true);
#endif  // ELPP_OS_UNIX
    }